

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

void * createNilObject(redisReadTask *task)

{
  int *piVar1;
  redisReply *parent;
  redisReply *r;
  redisReadTask *task_local;
  
  task_local = (redisReadTask *)createReplyObject(4);
  if ((redisReply *)task_local == (redisReply *)0x0) {
    task_local = (redisReadTask *)0x0;
  }
  else if (task->parent != (redisReadTask *)0x0) {
    piVar1 = (int *)task->parent->obj;
    if (((*piVar1 != 2) && (*piVar1 != 9)) && (*piVar1 != 10)) {
      __assert_fail("parent->type == REDIS_REPLY_ARRAY || parent->type == REDIS_REPLY_MAP || parent->type == REDIS_REPLY_SET"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                    ,0xef,"void *createNilObject(const redisReadTask *)");
    }
    *(redisReadTask **)(*(long *)(piVar1 + 0xc) + (long)task->idx * 8) = task_local;
  }
  return task_local;
}

Assistant:

static void *createNilObject(const redisReadTask *task) {
    redisReply *r, *parent;

    r = createReplyObject(REDIS_REPLY_NIL);
    if (r == NULL)
        return NULL;

    if (task->parent) {
        parent = task->parent->obj;
        assert(parent->type == REDIS_REPLY_ARRAY ||
               parent->type == REDIS_REPLY_MAP ||
               parent->type == REDIS_REPLY_SET);
        parent->element[task->idx] = r;
    }
    return r;
}